

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest::HasSpanWithComment
          (SourceInfoTest *this,char start_marker,char end_marker,Message *descriptor_proto,
          FieldDescriptor *field,int index,char *expected_leading_comments,
          char *expected_trailing_comments,char *expected_leading_detached_comments)

{
  pair<int,_int> pVar1;
  pair<int,_int> pVar2;
  bool bVar3;
  mapped_type *this_00;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  this_01;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>_>
  ppVar4;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var5;
  RepeatedField<int> *span2;
  char *pcVar6;
  lts_20250127 *this_02;
  undefined4 in_register_0000008c;
  string_view separator;
  bool local_2d1;
  const_iterator local_2b8;
  AssertHelper local_2b0;
  Message local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__2;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  Location *location;
  __normal_iterator<const_google::protobuf::SourceCodeInfo_Location_**,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>
  local_c8;
  iterator iter;
  RepeatedField<int> expected_span;
  pair<int,_int> end_pos;
  pair<int,_int> start_pos;
  vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>
  *range;
  undefined1 local_88 [8];
  node_type old;
  SpanKey key;
  int index_local;
  FieldDescriptor *field_local;
  Message *descriptor_proto_local;
  char end_marker_local;
  SourceInfoTest *pSStack_18;
  char start_marker_local;
  SourceInfoTest *this_local;
  
  descriptor_proto_local._6_1_ = end_marker;
  descriptor_proto_local._7_1_ = start_marker;
  pSStack_18 = this;
  SpanKey::SpanKey((SpanKey *)
                   (old.
                    super_node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                    .slot_space_ + 0x28),descriptor_proto,field,index);
  if (descriptor_proto_local._7_1_ == '\0') {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
    ::extract<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_0>
              ((node_type *)local_88,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                *)&this->spans_,
               (key_arg<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                *)(old.
                   super_node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                   .slot_space_ + 0x28));
    bVar3 = absl::lts_20250127::container_internal::
            node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
            ::empty((node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                     *)local_88);
    local_2d1 = true;
    if (!bVar3) {
      this_00 = absl::lts_20250127::container_internal::
                node_handle<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>,_void>
                ::mapped((node_handle<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>,_void>
                          *)local_88);
      local_2d1 = std::
                  vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>
                  ::empty(this_00);
    }
    this_local._7_1_ = (local_2d1 ^ 0xffU) & 1;
    absl::lts_20250127::container_internal::
    node_handle<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>,_void>
    ::~node_handle((node_handle<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>,_void>
                    *)local_88);
  }
  else {
    this_01 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>,absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::allocator<std::pair<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_const,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>>
              ::
              operator[]<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>,absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,std::allocator<std::pair<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey_const,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>>>
                          *)&this->spans_,
                         (key_arg<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                          *)(old.
                             super_node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                             .slot_space_ + 0x28));
    ppVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
             ::
             at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                         *)&this->markers_,(key_arg<char> *)((long)&descriptor_proto_local + 7));
    pVar1 = *ppVar4;
    ppVar4 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
             ::
             at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                         *)&this->markers_,(key_arg<char> *)((long)&descriptor_proto_local + 6));
    pVar2 = *ppVar4;
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&iter);
    end_pos.first = pVar1.first;
    RepeatedField<int>::Add((RepeatedField<int> *)&iter,end_pos.first);
    end_pos.second = pVar1.second;
    RepeatedField<int>::Add((RepeatedField<int> *)&iter,end_pos.second);
    expected_span.soo_rep_.field_0.long_rep.size = pVar2.first;
    if (expected_span.soo_rep_.field_0.long_rep.size != end_pos.first) {
      RepeatedField<int>::Add
                ((RepeatedField<int> *)&iter,expected_span.soo_rep_.field_0.long_rep.size);
    }
    expected_span.soo_rep_.field_0.long_rep.capacity = pVar2.second;
    RepeatedField<int>::Add
              ((RepeatedField<int> *)&iter,expected_span.soo_rep_.field_0.long_rep.capacity);
    local_c8._M_current =
         (SourceCodeInfo_Location **)
         std::
         vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>
         ::begin(this_01);
    while( true ) {
      location = (Location *)
                 std::
                 vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>
                 ::end(this_01);
      bVar3 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<const_google::protobuf::SourceCodeInfo_Location_**,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                          *)&location);
      if (!bVar3) break;
      p_Var5 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__gnu_cxx::
                  __normal_iterator<const_google::protobuf::SourceCodeInfo_Location_**,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>
                  ::operator*(&local_c8);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&p_Var5->_M_t;
      span2 = SourceCodeInfo_Location::span
                        ((SourceCodeInfo_Location *)
                         gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      bVar3 = CompareSpans((RepeatedField<int> *)&iter,span2);
      if (bVar3) {
        if (expected_leading_comments == (char *)0x0) {
          bVar3 = SourceCodeInfo_Location::has_leading_comments
                            ((SourceCodeInfo_Location *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
          local_e9 = (bool)(~bVar3 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_e8,&local_e9,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
          if (!bVar3) {
            testing::Message::Message(&local_f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__1.message_,(internal *)local_e8,
                       (AssertionResult *)"location->has_leading_comments()","true","false",
                       (char *)CONCAT44(in_register_0000008c,index));
            field = (FieldDescriptor *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_100,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc8f,(char *)field);
            testing::internal::AssertHelper::operator=(&local_100,&local_f8);
            testing::internal::AssertHelper::~AssertHelper(&local_100);
            std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
            testing::Message::~Message(&local_f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
        }
        else {
          local_131 = SourceCodeInfo_Location::has_leading_comments
                                ((SourceCodeInfo_Location *)
                                 gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_130,&local_131,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
          if (!bVar3) {
            testing::Message::Message(&local_140);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_130,
                       (AssertionResult *)"location->has_leading_comments()","false","true",
                       (char *)CONCAT44(in_register_0000008c,index));
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc91,pcVar6);
            testing::internal::AssertHelper::operator=(&local_148,&local_140);
            testing::internal::AssertHelper::~AssertHelper(&local_148);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_140);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
          field = (FieldDescriptor *)
                  SourceCodeInfo_Location::leading_comments_abi_cxx11_
                            ((SourceCodeInfo_Location *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
          testing::internal::EqHelper::
          Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_178,"expected_leading_comments",
                     "location->leading_comments()",&expected_leading_comments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar3) {
            testing::Message::Message(&local_180);
            field = (FieldDescriptor *)
                    testing::AssertionResult::failure_message((AssertionResult *)local_178);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc92,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__2.message_,&local_180);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_180);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        }
        if (expected_trailing_comments == (char *)0x0) {
          bVar3 = SourceCodeInfo_Location::has_trailing_comments
                            ((SourceCodeInfo_Location *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
          local_199 = (bool)(~bVar3 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_198,&local_199,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
          if (!bVar3) {
            testing::Message::Message(&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__3.message_,(internal *)local_198,
                       (AssertionResult *)"location->has_trailing_comments()","true","false",
                       (char *)CONCAT44(in_register_0000008c,index));
            field = (FieldDescriptor *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc95,(char *)field);
            testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
            testing::internal::AssertHelper::~AssertHelper(&local_1b0);
            std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_1a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
        }
        else {
          local_1e1 = SourceCodeInfo_Location::has_trailing_comments
                                ((SourceCodeInfo_Location *)
                                 gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
          if (!bVar3) {
            testing::Message::Message(&local_1f0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_1e0,
                       (AssertionResult *)"location->has_trailing_comments()","false","true",
                       (char *)CONCAT44(in_register_0000008c,index));
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc97,pcVar6);
            testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
            testing::internal::AssertHelper::~AssertHelper(&local_1f8);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_1f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
          field = (FieldDescriptor *)
                  SourceCodeInfo_Location::trailing_comments_abi_cxx11_
                            ((SourceCodeInfo_Location *)
                             gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
          testing::internal::EqHelper::
          Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_228,"expected_trailing_comments",
                     "location->trailing_comments()",&expected_trailing_comments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
          if (!bVar3) {
            testing::Message::Message(&local_230);
            field = (FieldDescriptor *)
                    testing::AssertionResult::failure_message((AssertionResult *)local_228);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc98,(char *)field);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_230);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_230);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
        }
        if (expected_leading_detached_comments == (char *)0x0) {
          local_250[1] = 0;
          local_250[0] = SourceCodeInfo_Location::leading_detached_comments_size
                                   ((SourceCodeInfo_Location *)
                                    gtest_ar_.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_248,"0","location->leading_detached_comments_size()",
                     local_250 + 1,local_250);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
          if (!bVar3) {
            testing::Message::Message(&local_258);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc9b,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_258);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_258);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
        }
        else {
          this_02 = (lts_20250127 *)
                    SourceCodeInfo_Location::leading_detached_comments_abi_cxx11_
                              ((SourceCodeInfo_Location *)
                               gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"\n");
          separator._M_str = (char *)field;
          separator._M_len = (size_t)local_2a0._M_str;
          absl::lts_20250127::StrJoin<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                    (&local_290,this_02,
                     (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_2a0._M_len,separator);
          testing::internal::EqHelper::
          Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_270,"expected_leading_detached_comments",
                     "absl::StrJoin(location->leading_detached_comments(), \"\\n\")",
                     &expected_leading_detached_comments,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar3) {
            testing::Message::Message(&local_2a8);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2b0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                       ,0xc9e,pcVar6);
            testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper(&local_2b0);
            testing::Message::~Message(&local_2a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        }
        __gnu_cxx::
        __normal_iterator<google::protobuf::SourceCodeInfo_Location_const*const*,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>
        ::__normal_iterator<google::protobuf::SourceCodeInfo_Location_const**>
                  ((__normal_iterator<google::protobuf::SourceCodeInfo_Location_const*const*,std::vector<google::protobuf::SourceCodeInfo_Location_const*,std::allocator<google::protobuf::SourceCodeInfo_Location_const*>>>
                    *)&local_2b8,&local_c8);
        std::
        vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>
        ::erase(this_01,local_2b8);
        this_local._7_1_ = 1;
        goto LAB_00fade8a;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::SourceCodeInfo_Location_**,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>
      ::operator++(&local_c8);
    }
    this_local._7_1_ = 0;
LAB_00fade8a:
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&iter);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HasSpanWithComment(char start_marker, char end_marker,
                          const Message& descriptor_proto,
                          const FieldDescriptor* field, int index,
                          const char* expected_leading_comments,
                          const char* expected_trailing_comments,
                          const char* expected_leading_detached_comments) {
    SpanKey key(descriptor_proto, field, index);
    if (start_marker == '\0') {
      auto old = spans_.extract(key);
      // Return true if we actually removed something.
      return !(old.empty() || old.mapped().empty());
    }

    std::vector<const SourceCodeInfo::Location*>& range = spans_[key];
    std::pair<int, int> start_pos = markers_.at(start_marker);
    std::pair<int, int> end_pos = markers_.at(end_marker);

    RepeatedField<int> expected_span;
    expected_span.Add(start_pos.first);
    expected_span.Add(start_pos.second);
    if (end_pos.first != start_pos.first) {
      expected_span.Add(end_pos.first);
    }
    expected_span.Add(end_pos.second);

    for (auto iter = range.begin(); iter != range.end(); ++iter) {
      const SourceCodeInfo::Location* location = *iter;
      if (CompareSpans(expected_span, location->span())) {
        if (expected_leading_comments == nullptr) {
          EXPECT_FALSE(location->has_leading_comments());
        } else {
          EXPECT_TRUE(location->has_leading_comments());
          EXPECT_EQ(expected_leading_comments, location->leading_comments());
        }
        if (expected_trailing_comments == nullptr) {
          EXPECT_FALSE(location->has_trailing_comments());
        } else {
          EXPECT_TRUE(location->has_trailing_comments());
          EXPECT_EQ(expected_trailing_comments, location->trailing_comments());
        }
        if (expected_leading_detached_comments == nullptr) {
          EXPECT_EQ(0, location->leading_detached_comments_size());
        } else {
          EXPECT_EQ(expected_leading_detached_comments,
                    absl::StrJoin(location->leading_detached_comments(), "\n"));
        }
        range.erase(iter);
        return true;
      }
    }

    return false;
  }